

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeLoad
          (ScalarReplacementPass *this,Instruction *load,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint uVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  IRContext *pIVar6;
  BasicBlock *block_00;
  size_type __n;
  reference ppIVar7;
  Instruction *this_00;
  Operand *pOVar8;
  Instruction *pIVar9;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *p_Var10;
  pointer pIVar11;
  DefUseManager *pDVar12;
  Operand *local_240;
  iterator local_230;
  uint32_t local_224;
  iterator local_220;
  undefined8 local_218;
  SmallVector<unsigned_int,_2UL> local_210;
  undefined1 local_1e8 [8];
  Operand op;
  Instruction *l;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_180
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  compositeConstruct;
  Instruction *pIStack_168;
  uint32_t compositeId;
  iterator local_160;
  undefined1 local_158 [8];
  Operand copy;
  allocator<spvtools::opt::Operand> local_11d;
  uint32_t i;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  iterator local_b0;
  _func_int **local_a8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_88;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newLoad;
  uint32_t loadId;
  Instruction *type;
  Instruction *var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  iterator where;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> loads;
  BasicBlock *block;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *load_local;
  ScalarReplacementPass *this_local;
  
  pIVar6 = Pass::context((Pass *)this);
  block_00 = IRContext::get_instr_block(pIVar6,load);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &where);
  __n = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        size(replacements);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::reserve
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &where,__n);
  InstructionList::iterator::iterator((iterator *)&__range2,load);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(replacements);
  var = (Instruction *)
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        end(replacements);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&var);
    if (!bVar2) {
      uVar4 = Pass::TakeNextId((Pass *)this);
      if (uVar4 == 0) {
        this_local._7_1_ = false;
        newLoad._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        InstructionList::iterator::iterator((iterator *)&compositeConstruct,load);
        InstructionList::iterator::operator=((iterator *)&__range2,(iterator *)&compositeConstruct);
        pIVar9 = (Instruction *)::operator_new(0x70);
        pIVar6 = Pass::context((Pass *)this);
        uVar5 = opt::Instruction::type_id(load);
        memset(&__range2_1,0,0x18);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &__range2_1);
        opt::Instruction::Instruction
                  (pIVar9,pIVar6,OpCompositeConstruct,uVar5,uVar4,(OperandList *)&__range2_1);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&local_180,pIVar9);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &__range2_1);
        __end2_1 = std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)&where);
        l = (Instruction *)
            std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&where);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                              *)&l);
          if (!bVar2) break;
          p_Var10 = (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)__gnu_cxx::
                       __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                       ::operator*(&__end2_1);
          op.words.large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = *(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                           *)&p_Var10->_M_t;
          local_224 = opt::Instruction::result_id
                                ((Instruction *)
                                 op.words.large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl);
          local_220 = &local_224;
          local_218 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_220;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_210,init_list);
          Operand::Operand((Operand *)local_1e8,SPV_OPERAND_TYPE_ID,&local_210);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_210);
          pIVar11 = std::
                    unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ::operator->(&local_180);
          opt::Instruction::AddOperand(pIVar11,(Operand *)local_1e8);
          Operand::~Operand((Operand *)local_1e8);
          __gnu_cxx::
          __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          ::operator++(&__end2_1);
        }
        InstructionList::iterator::InsertBefore
                  (&local_230,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&__range2);
        InstructionList::iterator::operator=((iterator *)&__range2,&local_230);
        pDVar12 = Pass::get_def_use_mgr((Pass *)this);
        pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)&__range2);
        analysis::DefUseManager::AnalyzeInstDefUse(pDVar12,pIVar9);
        pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)&__range2);
        opt::Instruction::UpdateDebugInfoFrom(pIVar9,load);
        pIVar6 = Pass::context((Pass *)this);
        pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)&__range2);
        IRContext::set_instr_block(pIVar6,pIVar9,block_00);
        pIVar6 = Pass::context((Pass *)this);
        uVar5 = opt::Instruction::result_id(load);
        IRContext::ReplaceAllUsesWith(pIVar6,uVar5,uVar4);
        this_local._7_1_ = true;
        newLoad._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = 1;
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_180);
      }
LAB_0088de86:
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&where);
      return this_local._7_1_;
    }
    ppIVar7 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    type = *ppIVar7;
    OVar3 = opt::Instruction::opcode(type);
    if (OVar3 == OpVariable) {
      pIVar9 = GetStorageType(this,type);
      newLoad._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
           Pass::TakeNextId((Pass *)this);
      if (newLoad._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) {
        this_local._7_1_ = false;
        newLoad._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_0088de86;
      }
      this_00 = (Instruction *)::operator_new(0x70);
      pIVar6 = Pass::context((Pass *)this);
      uVar5 = opt::Instruction::result_id(pIVar9);
      uVar4 = newLoad._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
      i = opt::Instruction::result_id(type);
      local_118 = &i;
      local_110 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_118;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_00);
      Operand::Operand(&local_e0,SPV_OPERAND_TYPE_ID,&local_108);
      local_b0 = &local_e0;
      local_a8 = (_func_int **)0x1;
      std::allocator<spvtools::opt::Operand>::allocator(&local_11d);
      __l._M_len = (size_type)local_a8;
      __l._M_array = local_b0;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_a0,__l,&local_11d);
      opt::Instruction::Instruction(this_00,pIVar6,OpLoad,uVar5,uVar4,&local_a0);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_88,this_00);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_a0);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_11d);
      local_240 = (Operand *)&local_b0;
      do {
        local_240 = local_240 + -1;
        Operand::~Operand(local_240);
      } while (local_240 != &local_e0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
      copy.words.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl._4_4_ = 1;
      while( true ) {
        uVar1 = copy.words.large_data_._M_t.
                super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl._4_4_;
        uVar4 = opt::Instruction::NumInOperands(load);
        if (uVar4 <= uVar1) break;
        pOVar8 = opt::Instruction::GetInOperand
                           (load,copy.words.large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl._4_4_);
        Operand::Operand((Operand *)local_158,pOVar8);
        pIVar11 = std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::operator->(&local_88);
        opt::Instruction::AddOperand(pIVar11,(Operand *)local_158);
        Operand::~Operand((Operand *)local_158);
        copy.words.large_data_._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl._4_4_ =
             copy.words.large_data_._M_t.
             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl._4_4_ + 1;
      }
      InstructionList::iterator::InsertBefore
                (&local_160,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&__range2);
      InstructionList::iterator::operator=((iterator *)&__range2,&local_160);
      pDVar12 = Pass::get_def_use_mgr((Pass *)this);
      pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&__range2);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar12,pIVar9);
      pIVar6 = Pass::context((Pass *)this);
      pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&__range2);
      IRContext::set_instr_block(pIVar6,pIVar9,block_00);
      pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&__range2);
      opt::Instruction::UpdateDebugInfoFrom(pIVar9,load);
      pIStack_168 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator*
                              ((iterator_template<spvtools::opt::Instruction> *)&__range2);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&where,&stack0xfffffffffffffe98);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_88);
    }
    else {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&where,&type);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeLoad(
    Instruction* load, const std::vector<Instruction*>& replacements) {
  // Replaces the load of the entire composite with a load from each replacement
  // variable followed by a composite construction.
  BasicBlock* block = context()->get_instr_block(load);
  std::vector<Instruction*> loads;
  loads.reserve(replacements.size());
  BasicBlock::iterator where(load);
  for (auto var : replacements) {
    // Create a load of each replacement variable.
    if (var->opcode() != spv::Op::OpVariable) {
      loads.push_back(var);
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t loadId = TakeNextId();
    if (loadId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> newLoad(
        new Instruction(context(), spv::Op::OpLoad, type->result_id(), loadId,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
    // Copy memory access attributes which start at index 1. Index 0 is the
    // pointer to load.
    for (uint32_t i = 1; i < load->NumInOperands(); ++i) {
      Operand copy(load->GetInOperand(i));
      newLoad->AddOperand(std::move(copy));
    }
    where = where.InsertBefore(std::move(newLoad));
    get_def_use_mgr()->AnalyzeInstDefUse(&*where);
    context()->set_instr_block(&*where, block);
    where->UpdateDebugInfoFrom(load);
    loads.push_back(&*where);
  }

  // Construct a new composite.
  uint32_t compositeId = TakeNextId();
  if (compositeId == 0) {
    return false;
  }
  where = load;
  std::unique_ptr<Instruction> compositeConstruct(
      new Instruction(context(), spv::Op::OpCompositeConstruct, load->type_id(),
                      compositeId, {}));
  for (auto l : loads) {
    Operand op(SPV_OPERAND_TYPE_ID,
               std::initializer_list<uint32_t>{l->result_id()});
    compositeConstruct->AddOperand(std::move(op));
  }
  where = where.InsertBefore(std::move(compositeConstruct));
  get_def_use_mgr()->AnalyzeInstDefUse(&*where);
  where->UpdateDebugInfoFrom(load);
  context()->set_instr_block(&*where, block);
  context()->ReplaceAllUsesWith(load->result_id(), compositeId);
  return true;
}